

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int _c;
  int *piVar26;
  size_t sVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  ulong uVar36;
  uint *puVar37;
  void *pvVar38;
  undefined1 (*pauVar39) [32];
  long lVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  uint *puVar44;
  int iVar45;
  uint uVar46;
  void *pvVar47;
  long lVar48;
  uint uVar49;
  long lVar50;
  void *pvVar51;
  ulong uVar52;
  long lVar53;
  void *pvVar54;
  int i;
  uint uVar55;
  void *pvVar56;
  undefined8 *puVar57;
  ulong uVar58;
  long lVar59;
  void *pvVar60;
  ulong uVar61;
  uint uVar62;
  uint *puVar63;
  long lVar64;
  uint *puVar65;
  long lVar66;
  void *pvVar67;
  void *pvVar68;
  uint uVar69;
  ulong uVar70;
  void *pvVar71;
  undefined1 auVar72 [16];
  short asVar73 [4];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  void *local_390;
  void *local_378;
  void *local_370;
  int tiles;
  int nRowBlocks;
  ulong local_348;
  int nColBlocks;
  Mat top_blob_bordered;
  void *local_2e8;
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  long local_2c8;
  void *local_2c0;
  void *local_2b8;
  long local_2b0;
  void *local_2a8;
  long local_2a0;
  long local_298;
  void *local_290;
  Mat top_blob_tm;
  Mat local_238;
  undefined1 local_1e8 [56];
  uint local_1b0;
  size_t local_1a8;
  ulong local_1a0;
  ulong local_198;
  void *local_190;
  ulong local_188;
  uint local_17c;
  Mat *local_178;
  ulong local_170;
  long local_168;
  size_t local_160;
  size_t local_158;
  long local_150;
  long local_148;
  ulong local_140;
  short d2 [4];
  short d3 [4];
  int sum3 [16];
  Option opt_b;
  
  uVar46 = bottom_blob->c;
  uVar43 = top_blob->w;
  local_188 = (ulong)uVar43;
  uVar62 = top_blob->h;
  local_198 = (ulong)uVar62;
  _c = top_blob->c;
  uVar36 = (ulong)_c;
  piVar26 = bottom_blob->refcount;
  local_1e8._0_8_ = bottom_blob->data;
  local_1e8._8_4_ = SUB84(bottom_blob->refcount,0);
  local_1e8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1e8._16_8_ = bottom_blob->elemsize;
  local_1e8._24_4_ = bottom_blob->elempack;
  local_1e8._32_8_ = bottom_blob->allocator;
  local_1e8._40_4_ = bottom_blob->dims;
  local_1e8._44_4_ = bottom_blob->w;
  local_1e8._48_4_ = bottom_blob->h;
  local_1e8._52_4_ = bottom_blob->d;
  local_1a8 = bottom_blob->cstep;
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + 1;
    UNLOCK();
  }
  uVar69 = (uVar43 - ((int)(uVar43 + 1) >> 0x1f)) + 1;
  uVar43 = uVar69 & 0xfffffffe;
  local_170 = (ulong)uVar43;
  uVar62 = (uVar62 - ((int)(uVar62 + 1) >> 0x1f)) + 1;
  local_17c = uVar62 & 0xfffffffe;
  iVar45 = uVar43 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_reserved_1 = opt->use_reserved_1;
  opt_b.use_reserved_2 = opt->use_reserved_2;
  opt_b.use_reserved_3 = opt->use_reserved_3;
  opt_b.use_reserved_4 = opt->use_reserved_4;
  opt_b.use_reserved_5 = opt->use_reserved_5;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_1b0 = uVar46;
  copy_make_border(bottom_blob,(Mat *)local_1e8,0,(local_17c - bottom_blob->h) + 2,0,
                   iVar45 - bottom_blob->w,0,0.0,&opt_b);
  uVar69 = (int)uVar69 >> 1;
  uVar62 = (int)uVar62 >> 1;
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  uVar43 = uVar62 * uVar69;
  local_178 = top_blob;
  Mat::create(&local_238,0x10,uVar43,uVar46,2,opt->workspace_allocator);
  auVar1 = _DAT_0031adb0;
  auVar72 = _DAT_0031ada0;
  uVar61 = (ulong)uVar46;
  if (0 < (int)uVar46) {
    lVar48 = (long)iVar45;
    uVar49 = 1;
    if (1 < (int)uVar69) {
      uVar49 = uVar69;
    }
    uVar52 = 1;
    if (1 < (int)uVar62) {
      uVar52 = (ulong)uVar62;
    }
    uVar58 = 0;
    do {
      if (0 < (int)local_198) {
        pvVar67 = (void *)(local_238.cstep * local_238.elemsize * uVar58 + (long)local_238.data);
        uVar70 = 0;
        do {
          if (0 < (int)local_188) {
            puVar44 = (uint *)(local_1e8._0_8_ +
                              (long)(iVar45 * 2 * (int)uVar70) +
                              local_1a8 * local_1e8._16_8_ * uVar58);
            puVar63 = (uint *)((long)puVar44 + lVar48);
            puVar65 = (uint *)((long)puVar63 + lVar48);
            puVar37 = (uint *)(lVar48 + (long)puVar65);
            uVar55 = 0;
            do {
              auVar75 = vpmovsxbw_avx(ZEXT416(*puVar44));
              auVar74 = vpmovsxbw_avx(ZEXT416(*puVar63));
              auVar28 = vpmovsxbw_avx(ZEXT416(*puVar65));
              auVar29 = vpmovsxbw_avx(ZEXT416(*puVar37));
              auVar31 = vpsubw_avx(auVar75,auVar28);
              auVar75 = vpaddw_avx(auVar74,auVar28);
              auVar32 = vpsubw_avx(auVar28,auVar74);
              auVar33 = vpsubw_avx(auVar29,auVar74);
              auVar74 = vpsrld_avx(auVar31,0x10);
              auVar28 = vpshufd_avx(auVar31,0x55);
              auVar76 = vpsrlq_avx(auVar31,0x30);
              auVar31 = vpunpcklwd_avx(auVar31,auVar75);
              auVar74 = vpblendw_avx(auVar74,auVar75,2);
              auVar29 = vpshufd_avx(auVar75,0x55);
              auVar28 = vpunpcklwd_avx(auVar28,auVar29);
              auVar75 = vpsrlq_avx(auVar75,0x30);
              auVar29 = vpunpcklwd_avx(auVar76,auVar75);
              auVar31 = vpunpckldq_avx(auVar31,auVar32);
              auVar75 = vpsrld_avx(auVar32,0x10);
              auVar76 = vpunpckldq_avx(auVar74,auVar75);
              auVar75 = vpblendw_avx(auVar28,auVar32,0xc);
              auVar74 = vpsrlq_avx(auVar32,0x30);
              auVar32 = vpunpckldq_avx(auVar29,auVar74);
              auVar74 = vpunpcklwd_avx(auVar31,auVar33);
              auVar28 = vpshufb_avx(auVar74,auVar72);
              auVar74 = vpunpcklwd_avx(auVar76,auVar33);
              auVar29 = vpshufb_avx(auVar74,auVar1);
              auVar75 = vpunpcklwd_avx(auVar75,auVar33);
              auVar75 = vpshuflw_avx(auVar75,0xe8);
              auVar31 = vpshufd_avx(auVar75,0xe8);
              auVar74 = vpblendw_avx(auVar32,auVar33,8);
              auVar75 = vpsubw_avx(auVar28,auVar31);
              top_blob_tm.data = auVar75._0_8_;
              auVar75 = vpaddw_avx(auVar29,auVar31);
              top_blob_bordered.data = auVar75._0_8_;
              auVar75 = vpsubw_avx(auVar31,auVar29);
              asVar73 = auVar75._0_8_;
              d2[0] = asVar73[0];
              d2[1] = asVar73[1];
              d2[2] = asVar73[2];
              d2[3] = asVar73[3];
              auVar75 = vpsubw_avx(auVar74,auVar29);
              asVar73 = auVar75._0_8_;
              d3[0] = asVar73[0];
              d3[1] = asVar73[1];
              d3[2] = asVar73[2];
              d3[3] = asVar73[3];
              lVar40 = 0;
              do {
                *(undefined2 *)((long)pvVar67 + lVar40) =
                     *(undefined2 *)((long)&top_blob_tm.data + lVar40);
                *(undefined2 *)((long)pvVar67 + lVar40 + 8) =
                     *(undefined2 *)((long)&top_blob_bordered.data + lVar40);
                *(undefined2 *)((long)pvVar67 + lVar40 + 0x10) = *(undefined2 *)((long)d2 + lVar40);
                *(undefined2 *)((long)pvVar67 + lVar40 + 0x18) = *(undefined2 *)((long)d3 + lVar40);
                lVar40 = lVar40 + 2;
              } while (lVar40 != 8);
              puVar44 = (uint *)((long)puVar44 + 2);
              puVar63 = (uint *)((long)puVar63 + 2);
              puVar65 = (uint *)((long)puVar65 + 2);
              puVar37 = (uint *)((long)puVar37 + 2);
              pvVar67 = (void *)((long)pvVar67 + 0x20);
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar49);
          }
          uVar70 = uVar70 + 1;
        } while (uVar70 != uVar52);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != uVar61);
  }
  top_blob_tm.cstep = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0;
  top_blob_tm.refcount._4_4_ = 0;
  top_blob_tm.elemsize = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.d = 0;
  top_blob_tm.c = 0;
  piVar26 = (int *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if ((Allocator *)local_1e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1e8._0_8_ != (void *)0x0) {
          free((void *)local_1e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1e8._32_8_)[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_);
  local_1e8._0_8_ = top_blob_tm.data;
  local_1e8._8_4_ = top_blob_tm.refcount._0_4_;
  local_1e8._12_4_ = top_blob_tm.refcount._4_4_;
  local_1e8._16_8_ = top_blob_tm.elemsize;
  local_1e8._24_4_ = top_blob_tm.elempack;
  local_1e8._32_8_ = top_blob_tm.allocator;
  local_1e8._44_4_ = top_blob_tm.w;
  local_1e8._40_4_ = top_blob_tm.dims;
  local_1e8._48_4_ = top_blob_tm.h;
  local_1e8._52_4_ = top_blob_tm.d;
  local_1b0 = top_blob_tm.c;
  local_1a8 = top_blob_tm.cstep;
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (top_blob_tm.allocator == (Allocator *)0x0) {
        if (top_blob_tm.data != (void *)0x0) {
          free(top_blob_tm.data);
        }
      }
      else {
        (*(top_blob_tm.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  top_blob_tm.cstep = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0;
  top_blob_tm.refcount._4_4_ = 0;
  top_blob_tm.elemsize = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.d = 0;
  top_blob_tm.c = 0;
  Mat::create(&top_blob_tm,0x10,uVar43,_c,4,opt->workspace_allocator);
  local_348 = uVar36 & 0xfffffffffffffffc;
  if (0 < _c >> 2) {
    local_290 = kernel_tm->data;
    local_160 = kernel_tm->elemsize;
    local_140 = (ulong)(uint)(_c >> 2);
    local_158 = top_blob_tm.elemsize;
    lVar40 = top_blob_tm.cstep * top_blob_tm.elemsize;
    lVar48 = kernel_tm->cstep * local_160;
    local_148 = lVar48 * 4;
    local_298 = (long)local_290 + lVar48 + 0x60;
    local_2a0 = (long)local_290 + lVar48 * 2 + 0x60;
    local_2b0 = (long)local_290 + lVar48 * 3 + 0x60;
    local_2b8 = (void *)((long)local_290 + lVar48);
    local_2c0 = (void *)((long)local_290 + lVar48 * 2);
    local_2a8 = (void *)(lVar48 * 3 + (long)local_290);
    local_2e0 = (void *)(lVar40 * 3 + (long)top_blob_tm.data);
    local_150 = lVar40 * 4;
    local_2e8 = (void *)((long)top_blob_tm.data + lVar40 * 2);
    local_2d0 = top_blob_tm.data;
    local_2d8 = (void *)(lVar40 + (long)top_blob_tm.data);
    local_2c8 = (long)local_290 + 0x60;
    local_168 = local_160 * 4;
    uVar52 = 0;
    do {
      local_1a0 = uVar52;
      if (0 < (int)uVar43) {
        local_190 = (void *)((long)top_blob_tm.w * top_blob_tm.elemsize);
        lVar40 = local_168 * kernel_tm->w;
        lVar48 = (long)kernel_tm->w * local_160;
        local_390 = (void *)0x0;
        pvVar67 = local_2e0;
        pvVar51 = local_2d0;
        pvVar54 = local_2d8;
        pvVar56 = local_2e8;
        do {
          uVar52 = 0;
          top_blob_bordered.allocator = (Allocator *)0x0;
          top_blob_bordered.dims = 0;
          top_blob_bordered.w = 0;
          top_blob_bordered.h = 0;
          top_blob_bordered.d = 0;
          top_blob_bordered.c = 0;
          top_blob_bordered._60_4_ = 0;
          top_blob_bordered.data = (void *)0x0;
          top_blob_bordered.refcount._0_4_ = 0;
          top_blob_bordered.refcount._4_4_ = 0;
          top_blob_bordered.elemsize = 0;
          top_blob_bordered.elempack = 0;
          top_blob_bordered._28_4_ = 0;
          d2[0] = 0;
          d2[1] = 0;
          d2[2] = 0;
          d2[3] = 0;
          d3[0] = 0;
          d3[1] = 0;
          d3[2] = 0;
          d3[3] = 0;
          sum3[8] = 0;
          sum3[9] = 0;
          sum3[10] = 0;
          sum3[0xb] = 0;
          sum3[0xc] = 0;
          sum3[0xd] = 0;
          sum3[0xe] = 0;
          sum3[0xf] = 0;
          sum3[0] = 0;
          sum3[1] = 0;
          sum3[2] = 0;
          sum3[3] = 0;
          sum3[4] = 0;
          sum3[5] = 0;
          sum3[6] = 0;
          sum3[7] = 0;
          if (3 < (int)uVar46) {
            lVar59 = (long)local_238.w * (long)local_390;
            pvVar60 = (void *)(lVar59 * local_238.elemsize + (long)local_238.data);
            lVar41 = local_238.cstep * local_238.elemsize * 4;
            pvVar38 = (void *)((local_238.cstep + lVar59) * local_238.elemsize +
                              (long)local_238.data);
            pvVar71 = (void *)((lVar59 + local_238.cstep * 2) * local_238.elemsize +
                              (long)local_238.data);
            pvVar47 = (void *)((local_238.cstep * 3 + lVar59) * local_238.elemsize +
                              (long)local_238.data);
            lVar59 = local_2c8;
            lVar53 = local_298;
            lVar64 = local_2a0;
            lVar66 = local_2b0;
            uVar58 = 0;
            do {
              lVar50 = 0;
              do {
                auVar72._8_8_ = 0;
                auVar72._0_8_ = *(ulong *)((long)pvVar60 + lVar50);
                auVar30 = vpmovsxwd_avx(auVar72);
                auVar1._8_8_ = 0;
                auVar1._0_8_ = *(ulong *)(lVar59 + -0x60 + lVar50);
                auVar72 = vpmovzxwd_avx(auVar1);
                auVar72 = vpmaddwd_avx(auVar72,auVar30);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])
                                              ((long)&top_blob_bordered.data + lVar50 * 2));
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar50 * 2) = auVar72;
                auVar75._8_8_ = 0;
                auVar75._0_8_ = *(ulong *)((long)pvVar38 + lVar50);
                auVar75 = vpmovsxwd_avx(auVar75);
                auVar74._8_8_ = 0;
                auVar74._0_8_ = *(ulong *)(lVar59 + -0x40 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar74);
                auVar1 = vpmaddwd_avx(auVar1,auVar75);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar50 * 2) = auVar72;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = *(ulong *)((long)pvVar71 + lVar50);
                auVar74 = vpmovsxwd_avx(auVar28);
                auVar29._8_8_ = 0;
                auVar29._0_8_ = *(ulong *)(lVar59 + -0x20 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar29);
                auVar1 = vpmaddwd_avx(auVar1,auVar74);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar50 * 2) = auVar72;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *(ulong *)((long)pvVar47 + lVar50);
                auVar28 = vpmovsxwd_avx(auVar31);
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)(lVar59 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar32);
                auVar1 = vpmaddwd_avx(auVar1,auVar28);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar50 * 2) = auVar72;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = *(ulong *)(lVar53 + -0x60 + lVar50);
                auVar72 = vpmovzxwd_avx(auVar33);
                auVar72 = vpmaddwd_avx(auVar72,auVar30);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])(d2 + lVar50));
                *(undefined1 (*) [16])(d2 + lVar50) = auVar72;
                auVar76._8_8_ = 0;
                auVar76._0_8_ = *(ulong *)(lVar53 + -0x40 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar76);
                auVar1 = vpmaddwd_avx(auVar1,auVar75);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])(d2 + lVar50) = auVar72;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = *(ulong *)(lVar53 + -0x20 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar2);
                auVar1 = vpmaddwd_avx(auVar1,auVar74);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])(d2 + lVar50) = auVar72;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *(ulong *)(lVar53 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar3);
                auVar1 = vpmaddwd_avx(auVar1,auVar28);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])(d2 + lVar50) = auVar72;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *(ulong *)(lVar64 + -0x60 + lVar50);
                auVar72 = vpmovzxwd_avx(auVar4);
                auVar72 = vpmaddwd_avx(auVar72,auVar30);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])(d3 + lVar50));
                *(undefined1 (*) [16])(d3 + lVar50) = auVar72;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)(lVar64 + -0x40 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar5);
                auVar1 = vpmaddwd_avx(auVar1,auVar75);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])(d3 + lVar50) = auVar72;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = *(ulong *)(lVar64 + -0x20 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar6);
                auVar1 = vpmaddwd_avx(auVar1,auVar74);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])(d3 + lVar50) = auVar72;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)(lVar64 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar7);
                auVar1 = vpmaddwd_avx(auVar1,auVar28);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])(d3 + lVar50) = auVar72;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)(lVar66 + -0x60 + lVar50);
                auVar72 = vpmovzxwd_avx(auVar8);
                auVar72 = vpmaddwd_avx(auVar72,auVar30);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])((long)sum3 + lVar50 * 2));
                *(undefined1 (*) [16])((long)sum3 + lVar50 * 2) = auVar72;
                auVar30._8_8_ = 0;
                auVar30._0_8_ = *(ulong *)(lVar66 + -0x40 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar30);
                auVar1 = vpmaddwd_avx(auVar1,auVar75);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)sum3 + lVar50 * 2) = auVar72;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *(ulong *)(lVar66 + -0x20 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar9);
                auVar1 = vpmaddwd_avx(auVar1,auVar74);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)sum3 + lVar50 * 2) = auVar72;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)(lVar66 + lVar50);
                auVar1 = vpmovzxwd_avx(auVar10);
                auVar1 = vpmaddwd_avx(auVar1,auVar28);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)sum3 + lVar50 * 2) = auVar72;
                lVar50 = lVar50 + 8;
              } while (lVar50 != 0x20);
              uVar52 = uVar58 + 4;
              lVar50 = uVar58 + 7;
              pvVar60 = (void *)((long)pvVar60 + lVar41);
              lVar59 = lVar59 + lVar40;
              pvVar38 = (void *)((long)pvVar38 + lVar41);
              pvVar71 = (void *)((long)pvVar71 + lVar41);
              pvVar47 = (void *)((long)pvVar47 + lVar41);
              lVar53 = lVar53 + lVar40;
              lVar64 = lVar64 + lVar40;
              lVar66 = lVar66 + lVar40;
              uVar58 = uVar52;
            } while (lVar50 < (int)uVar46);
          }
          if ((int)uVar52 < (int)uVar46) {
            uVar52 = uVar52 & 0xffffffff;
            pvVar60 = (void *)((local_238.cstep * uVar52 + (long)local_238.w * (long)local_390) *
                               local_238.elemsize + (long)local_238.data);
            lVar59 = lVar48 * uVar52;
            pvVar71 = (void *)((long)local_290 + lVar59);
            pvVar38 = (void *)((long)local_2b8 + lVar59);
            pvVar68 = (void *)((long)local_2c0 + lVar59);
            pvVar47 = (void *)(lVar59 + (long)local_2a8);
            do {
              lVar59 = 0;
              do {
                auVar11._8_8_ = 0;
                auVar11._0_8_ = *(ulong *)((long)pvVar60 + lVar59);
                auVar1 = vpmovsxwd_avx(auVar11);
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *(ulong *)((long)pvVar71 + lVar59);
                auVar72 = vpmovzxwd_avx(auVar12);
                auVar72 = vpmaddwd_avx(auVar72,auVar1);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])
                                              ((long)&top_blob_bordered.data + lVar59 * 2));
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar59 * 2) = auVar72;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = *(ulong *)((long)pvVar38 + lVar59);
                auVar72 = vpmovzxwd_avx(auVar13);
                auVar72 = vpmaddwd_avx(auVar72,auVar1);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])(d2 + lVar59));
                *(undefined1 (*) [16])(d2 + lVar59) = auVar72;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = *(ulong *)((long)pvVar68 + lVar59);
                auVar72 = vpmovzxwd_avx(auVar14);
                auVar72 = vpmaddwd_avx(auVar72,auVar1);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])(d3 + lVar59));
                *(undefined1 (*) [16])(d3 + lVar59) = auVar72;
                auVar15._8_8_ = 0;
                auVar15._0_8_ = *(ulong *)((long)pvVar47 + lVar59);
                auVar72 = vpmovzxwd_avx(auVar15);
                auVar72 = vpmaddwd_avx(auVar72,auVar1);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])((long)sum3 + lVar59 * 2));
                *(undefined1 (*) [16])((long)sum3 + lVar59 * 2) = auVar72;
                lVar59 = lVar59 + 8;
              } while (lVar59 != 0x20);
              uVar52 = uVar52 + 1;
              pvVar60 = (void *)((long)pvVar60 + local_238.cstep * local_238.elemsize);
              pvVar71 = (void *)((long)pvVar71 + lVar48);
              pvVar38 = (void *)((long)pvVar38 + lVar48);
              pvVar68 = (void *)((long)pvVar68 + lVar48);
              pvVar47 = (void *)((long)pvVar47 + lVar48);
            } while (uVar52 != uVar61);
          }
          lVar59 = 0;
          do {
            *(undefined4 *)((long)pvVar51 + lVar59) =
                 *(undefined4 *)((long)&top_blob_bordered.data + lVar59);
            *(undefined4 *)((long)pvVar54 + lVar59) = *(undefined4 *)((long)d2 + lVar59);
            *(undefined4 *)((long)pvVar56 + lVar59) = *(undefined4 *)((long)d3 + lVar59);
            *(undefined4 *)((long)pvVar67 + lVar59) = *(undefined4 *)((long)sum3 + lVar59);
            lVar59 = lVar59 + 4;
          } while (lVar59 != 0x40);
          local_390 = (void *)((long)local_390 + 1);
          pvVar67 = (void *)((long)pvVar67 + (long)local_190);
          pvVar56 = (void *)((long)pvVar56 + (long)local_190);
          pvVar54 = (void *)((long)pvVar54 + (long)local_190);
          pvVar51 = (void *)((long)pvVar51 + (long)local_190);
        } while (local_390 != (void *)(ulong)uVar43);
      }
      local_2c8 = local_2c8 + local_148;
      local_298 = local_298 + local_148;
      local_2a0 = local_2a0 + local_148;
      local_2b0 = local_2b0 + local_148;
      local_290 = (void *)((long)local_290 + local_148);
      local_2b8 = (void *)((long)local_2b8 + local_148);
      local_2c0 = (void *)((long)local_2c0 + local_148);
      local_2a8 = (void *)((long)local_2a8 + local_148);
      local_2e0 = (void *)((long)local_2e0 + local_150);
      local_2e8 = (void *)((long)local_2e8 + local_150);
      local_2d8 = (void *)((long)local_2d8 + local_150);
      local_2d0 = (void *)((long)local_2d0 + local_150);
      uVar52 = local_1a0 + 1;
    } while (local_1a0 + 1 != local_140);
  }
  if ((int)local_348 != _c) {
    local_190 = top_blob_tm.data;
    local_378 = kernel_tm->data;
    sVar27 = kernel_tm->elemsize;
    local_1a0 = top_blob_tm.elemsize;
    lVar48 = kernel_tm->cstep * sVar27;
    local_390 = (void *)(lVar48 * local_348 + (long)local_378);
    lVar40 = kernel_tm->cstep * local_348;
    do {
      if (0 < (int)uVar43) {
        lVar59 = (long)kernel_tm->w;
        lVar53 = sVar27 * 4 * lVar59;
        uVar52 = 0;
        do {
          uVar58 = 0;
          top_blob_bordered.allocator = (Allocator *)0x0;
          top_blob_bordered.dims = 0;
          top_blob_bordered.w = 0;
          top_blob_bordered.h = 0;
          top_blob_bordered.d = 0;
          top_blob_bordered.c = 0;
          top_blob_bordered._60_4_ = 0;
          top_blob_bordered.data = (void *)0x0;
          top_blob_bordered.refcount._0_4_ = 0;
          top_blob_bordered.refcount._4_4_ = 0;
          top_blob_bordered.elemsize = 0;
          top_blob_bordered.elempack = 0;
          top_blob_bordered._28_4_ = 0;
          if (3 < (int)uVar46) {
            lVar64 = (long)local_238.w * uVar52;
            pvVar38 = (void *)(lVar64 * local_238.elemsize + (long)local_238.data);
            lVar66 = local_238.cstep * local_238.elemsize * 4;
            pvVar47 = (void *)((local_238.cstep + lVar64) * local_238.elemsize +
                              (long)local_238.data);
            pvVar60 = (void *)((lVar64 + local_238.cstep * 2) * local_238.elemsize +
                              (long)local_238.data);
            pvVar71 = (void *)((local_238.cstep * 3 + lVar64) * local_238.elemsize +
                              (long)local_238.data);
            uVar70 = 0;
            pvVar67 = (void *)((long)local_390 + sVar27 * lVar59);
            pvVar51 = (void *)(sVar27 * 3 * lVar59 + (long)local_390);
            pvVar54 = (void *)(sVar27 * 2 * lVar59 + (long)local_390);
            pvVar56 = local_390;
            do {
              lVar64 = 0;
              do {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = *(ulong *)((long)pvVar38 + lVar64);
                auVar72 = vpmovzxwd_avx(auVar16);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = *(ulong *)((long)pvVar56 + lVar64);
                auVar1 = vpmovzxwd_avx(auVar17);
                auVar72 = vpmaddwd_avx(auVar1,auVar72);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])
                                              ((long)&top_blob_bordered.data + lVar64 * 2));
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar64 * 2) = auVar72;
                auVar18._8_8_ = 0;
                auVar18._0_8_ = *(ulong *)((long)pvVar47 + lVar64);
                auVar1 = vpmovzxwd_avx(auVar18);
                auVar19._8_8_ = 0;
                auVar19._0_8_ = *(ulong *)((long)pvVar67 + lVar64);
                auVar75 = vpmovzxwd_avx(auVar19);
                auVar1 = vpmaddwd_avx(auVar75,auVar1);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar64 * 2) = auVar72;
                auVar20._8_8_ = 0;
                auVar20._0_8_ = *(ulong *)((long)pvVar60 + lVar64);
                auVar1 = vpmovzxwd_avx(auVar20);
                auVar21._8_8_ = 0;
                auVar21._0_8_ = *(ulong *)((long)pvVar54 + lVar64);
                auVar75 = vpmovzxwd_avx(auVar21);
                auVar1 = vpmaddwd_avx(auVar75,auVar1);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar64 * 2) = auVar72;
                auVar22._8_8_ = 0;
                auVar22._0_8_ = *(ulong *)((long)pvVar71 + lVar64);
                auVar1 = vpmovzxwd_avx(auVar22);
                auVar23._8_8_ = 0;
                auVar23._0_8_ = *(ulong *)((long)pvVar51 + lVar64);
                auVar75 = vpmovzxwd_avx(auVar23);
                auVar1 = vpmaddwd_avx(auVar75,auVar1);
                auVar72 = vpaddd_avx(auVar1,auVar72);
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar64 * 2) = auVar72;
                lVar64 = lVar64 + 8;
              } while (lVar64 != 0x20);
              uVar58 = uVar70 + 4;
              lVar64 = uVar70 + 7;
              pvVar38 = (void *)((long)pvVar38 + lVar66);
              pvVar56 = (void *)((long)pvVar56 + lVar53);
              pvVar47 = (void *)((long)pvVar47 + lVar66);
              pvVar67 = (void *)((long)pvVar67 + lVar53);
              pvVar60 = (void *)((long)pvVar60 + lVar66);
              pvVar54 = (void *)((long)pvVar54 + lVar53);
              pvVar71 = (void *)((long)pvVar71 + lVar66);
              pvVar51 = (void *)((long)pvVar51 + lVar53);
              uVar70 = uVar58;
            } while (lVar64 < (int)uVar46);
          }
          if ((int)uVar58 < (int)uVar46) {
            uVar58 = uVar58 & 0xffffffff;
            pvVar67 = (void *)((local_238.cstep * uVar58 + (long)local_238.w * uVar52) *
                               local_238.elemsize + (long)local_238.data);
            pvVar51 = (void *)((lVar59 * uVar58 + lVar40) * sVar27 + (long)local_378);
            do {
              lVar64 = 0;
              do {
                auVar24._8_8_ = 0;
                auVar24._0_8_ = *(ulong *)((long)pvVar67 + lVar64 * 2);
                auVar72 = vpmovzxwd_avx(auVar24);
                auVar25._8_8_ = 0;
                auVar25._0_8_ = *(ulong *)((long)pvVar51 + lVar64 * 2);
                auVar1 = vpmovzxwd_avx(auVar25);
                auVar72 = vpmaddwd_avx(auVar1,auVar72);
                auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])
                                              ((long)&top_blob_bordered.data + lVar64 * 4));
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar64 * 4) = auVar72;
                lVar64 = lVar64 + 4;
              } while (lVar64 != 0x10);
              uVar58 = uVar58 + 1;
              pvVar67 = (void *)((long)pvVar67 + local_238.cstep * local_238.elemsize);
              pvVar51 = (void *)((long)pvVar51 + sVar27 * lVar59);
            } while (uVar58 != uVar61);
          }
          pauVar39 = (undefined1 (*) [32])
                     ((long)top_blob_tm.data +
                     (long)top_blob_tm.w * top_blob_tm.elemsize * uVar52 +
                     top_blob_tm.cstep * top_blob_tm.elemsize * local_348);
          auVar34._8_4_ = top_blob_bordered.refcount._0_4_;
          auVar34._0_8_ = top_blob_bordered.data;
          auVar34._12_4_ = top_blob_bordered.refcount._4_4_;
          auVar34._16_8_ = top_blob_bordered.elemsize;
          auVar34._24_4_ = top_blob_bordered.elempack;
          auVar34._28_4_ = top_blob_bordered._28_4_;
          *(Allocator **)pauVar39[1] = top_blob_bordered.allocator;
          *(ulong *)(pauVar39[1] + 8) = CONCAT44(top_blob_bordered.w,top_blob_bordered.dims);
          *(ulong *)(pauVar39[1] + 0x10) = CONCAT44(top_blob_bordered.d,top_blob_bordered.h);
          *(ulong *)(pauVar39[1] + 0x18) = CONCAT44(top_blob_bordered._60_4_,top_blob_bordered.c);
          *pauVar39 = auVar34;
          uVar52 = uVar52 + 1;
        } while (uVar52 != uVar43);
      }
      local_348 = local_348 + 1;
      local_390 = (void *)((long)local_390 + lVar48);
      local_378 = (void *)((long)local_378 + lVar48);
    } while ((long)local_348 < (long)uVar36);
  }
  top_blob_bordered.cstep = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.d = 0;
  top_blob_bordered.c = 0;
  piVar26 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  local_238.data = top_blob_bordered.data;
  local_238.refcount._0_4_ = top_blob_bordered.refcount._0_4_;
  local_238.refcount._4_4_ = top_blob_bordered.refcount._4_4_;
  local_238.elemsize = top_blob_bordered.elemsize;
  local_238.elempack = top_blob_bordered.elempack;
  local_238.allocator = top_blob_bordered.allocator;
  auVar35._4_4_ = top_blob_bordered.w;
  auVar35._0_4_ = top_blob_bordered.dims;
  auVar35._8_4_ = top_blob_bordered.h;
  auVar35._12_4_ = top_blob_bordered.d;
  local_238.dims = top_blob_bordered.dims;
  local_238.w = top_blob_bordered.w;
  local_238._48_8_ = auVar35._8_8_;
  local_238.c = top_blob_bordered.c;
  local_238.cstep = top_blob_bordered.cstep;
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (*(top_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  top_blob_bordered.cstep = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.d = 0;
  top_blob_bordered.c = 0;
  Mat::create(&top_blob_bordered,(int)local_170,local_17c,_c,4,opt->workspace_allocator);
  if (0 < _c) {
    uVar61 = 1;
    if (1 < (int)uVar69) {
      uVar61 = (ulong)uVar69;
    }
    uVar52 = 1;
    if (1 < (int)uVar62) {
      uVar52 = (ulong)uVar62;
    }
    local_370 = top_blob_tm.data;
    lVar48 = (long)top_blob_tm.data + 0x30;
    uVar58 = 0;
    do {
      if (0 < (int)local_198) {
        lVar40 = (long)top_blob_tm.w * top_blob_tm.elemsize;
        uVar46 = 0;
        uVar70 = 0;
        pvVar67 = local_370;
        do {
          if (0 < (int)local_188) {
            lVar59 = (ulong)uVar46 * lVar40 + lVar48;
            puVar57 = (undefined8 *)
                      ((long)top_blob_bordered.data +
                      uVar70 * (long)top_blob_bordered.w * top_blob_bordered.elemsize * 2 +
                      top_blob_bordered.cstep * top_blob_bordered.elemsize * uVar58);
            lVar53 = 0;
            uVar42 = uVar61;
            do {
              auVar72 = *(undefined1 (*) [16])(lVar59 + -0x20 + lVar53);
              auVar1 = *(undefined1 (*) [16])(lVar59 + -0x10 + lVar53);
              auVar75 = vpaddd_avx(auVar72,*(undefined1 (*) [16])((long)pvVar67 + lVar53));
              auVar75 = vpaddd_avx(auVar75,auVar1);
              auVar72 = vpsubd_avx(auVar72,auVar1);
              auVar72 = vpaddd_avx(auVar72,*(undefined1 (*) [16])(lVar59 + lVar53));
              auVar1 = vpshufd_avx(auVar75,0x55);
              auVar1 = vpblendw_avx(auVar1,auVar72,0xc);
              auVar29 = vpunpckhdq_avx(auVar75,auVar72);
              auVar74 = vpshufd_avx(auVar72,0xee);
              auVar28 = vpshufd_avx(auVar75,0xff);
              auVar72 = vphaddd_avx(auVar75,auVar72);
              auVar75 = vpblendw_avx(auVar28,auVar74,0xc);
              auVar72 = vpshufd_avx(auVar72,0xe8);
              auVar72 = vpaddd_avx(auVar72,auVar29);
              auVar1 = vpsubd_avx(auVar1,auVar29);
              auVar1 = vpaddd_avx(auVar1,auVar75);
              auVar72 = vpsrad_avx(auVar72,2);
              *puVar57 = auVar72._0_8_;
              auVar72 = vpsrad_avx(auVar1,2);
              *(long *)((long)puVar57 + (long)top_blob_bordered.w * top_blob_bordered.elemsize) =
                   auVar72._0_8_;
              puVar57 = puVar57 + 1;
              lVar53 = lVar53 + lVar40;
              uVar42 = uVar42 - 1;
            } while (uVar42 != 0);
          }
          uVar70 = uVar70 + 1;
          uVar46 = uVar46 + uVar69;
          pvVar67 = (void *)((long)pvVar67 + uVar69 * top_blob_tm.elemsize * (long)top_blob_tm.w);
        } while (uVar70 != uVar52);
      }
      uVar58 = uVar58 + 1;
      lVar48 = lVar48 + top_blob_tm.cstep * top_blob_tm.elemsize;
      local_370 = (void *)((long)local_370 + top_blob_tm.cstep * top_blob_tm.elemsize);
    } while (uVar58 != uVar36);
  }
  copy_cut_border(&top_blob_bordered,local_178,0,top_blob_bordered.h - local_178->h,0,
                  top_blob_bordered.w - local_178->w,opt);
  piVar26 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (*(top_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (top_blob_tm.allocator == (Allocator *)0x0) {
        if (top_blob_tm.data != (void *)0x0) {
          free(top_blob_tm.data);
        }
      }
      else {
        (*(top_blob_tm.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  piVar26 = (int *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if ((Allocator *)local_1e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1e8._0_8_ != (void *)0x0) {
          free((void *)local_1e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1e8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}